

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

OneWayPipe *
kj::newOneWayPipe(OneWayPipe *__return_storage_ptr__,Maybe<unsigned_long> *expectedLength)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  AsyncInputStream *pAVar3;
  AsyncInputStream *pAVar4;
  AsyncOutputStream *pAVar5;
  Refcounted *refcounted;
  HeapDisposer<kj::(anonymous_namespace)::PipeReadEnd> *this;
  Disposer *pDVar6;
  AsyncPipe *ptrCopy_1;
  AsyncInputStream *ptrCopy;
  
  pp_Var2 = (_func_int **)operator_new(0x68);
  pp_Var2[2] = (_func_int *)0x0;
  pp_Var2[3] = (_func_int *)0x0;
  pp_Var2[6] = (_func_int *)0x0;
  pp_Var2[7] = (_func_int *)0x0;
  pp_Var2[4] = (_func_int *)0x0;
  pp_Var2[5] = (_func_int *)0x0;
  pp_Var2[10] = (_func_int *)0x0;
  pp_Var2[0xb] = (_func_int *)0x0;
  pp_Var2[0xc] = (_func_int *)0x0;
  *pp_Var2 = (_func_int *)&PTR_read_00449f90;
  pp_Var2[1] = (_func_int *)&PTR_write_0044a020;
  pp_Var2[2] = (_func_int *)&PTR_disposeImpl_0044a050;
  *(undefined8 *)((long)pp_Var2 + 0x29) = 0;
  *(undefined8 *)((long)pp_Var2 + 0x31) = 0;
  pp_Var2[8] = (_func_int *)0x0;
  pp_Var2[9] = (_func_int *)0x0;
  *(code *)(pp_Var2 + 10) = (code)0x0;
  *(undefined4 *)(pp_Var2 + 3) = 2;
  pAVar3 = (AsyncInputStream *)operator_new(0x20);
  pAVar3->_vptr_AsyncInputStream = (_func_int **)&PTR_read_0044b640;
  pAVar3[1]._vptr_AsyncInputStream = pp_Var2 + 2;
  pAVar3[2]._vptr_AsyncInputStream = pp_Var2;
  UnwindDetector::UnwindDetector((UnwindDetector *)(pAVar3 + 3));
  if ((expectedLength->ptr).isSet == true) {
    pp_Var1 = (_func_int **)(expectedLength->ptr).field_1.value;
    this = (HeapDisposer<kj::(anonymous_namespace)::PipeReadEnd> *)0x20;
    pAVar4 = (AsyncInputStream *)operator_new(0x20);
    pAVar4->_vptr_AsyncInputStream = (_func_int **)&PTR_read_0044b6f0;
    pAVar4[1]._vptr_AsyncInputStream =
         (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::PipeReadEnd>::instance;
    pAVar4[2]._vptr_AsyncInputStream = (_func_int **)pAVar3;
    pAVar4[3]._vptr_AsyncInputStream = pp_Var1;
    pDVar6 = (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::LimitedInputStream>::instance;
    if (pp_Var1 == (_func_int **)0x0) {
      pAVar4[2]._vptr_AsyncInputStream = (_func_int **)0x0;
      _::HeapDisposer<kj::(anonymous_namespace)::PipeReadEnd>::disposeImpl
                (this,pAVar3->_vptr_AsyncInputStream[-2] + (long)pAVar3);
    }
  }
  else {
    pDVar6 = (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::PipeReadEnd>::instance;
    pAVar4 = pAVar3;
  }
  pAVar5 = (AsyncOutputStream *)operator_new(0x20);
  pAVar5->_vptr_AsyncOutputStream = (_func_int **)&PTR_write_0044b880;
  pAVar5[1]._vptr_AsyncOutputStream = pp_Var2 + 2;
  pAVar5[2]._vptr_AsyncOutputStream = pp_Var2;
  UnwindDetector::UnwindDetector((UnwindDetector *)(pAVar5 + 3));
  (__return_storage_ptr__->in).disposer = pDVar6;
  (__return_storage_ptr__->in).ptr = pAVar4;
  (__return_storage_ptr__->out).disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::PipeWriteEnd>::instance;
  (__return_storage_ptr__->out).ptr = pAVar5;
  return __return_storage_ptr__;
}

Assistant:

OneWayPipe newOneWayPipe(kj::Maybe<uint64_t> expectedLength) {
  auto impl = kj::refcounted<AsyncPipe>();
  Own<AsyncInputStream> readEnd = kj::heap<PipeReadEnd>(kj::addRef(*impl));
  KJ_IF_MAYBE(l, expectedLength) {
    readEnd = kj::heap<LimitedInputStream>(kj::mv(readEnd), *l);
  }
  Own<AsyncOutputStream> writeEnd = kj::heap<PipeWriteEnd>(kj::mv(impl));
  return { kj::mv(readEnd), kj::mv(writeEnd) };
}